

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

void __thiscall S2LatLngRect::Encode(S2LatLngRect *this,Encoder *encoder)

{
  S2LogMessage local_20;
  
  Encoder::Ensure(encoder,0x28);
  Encoder::put8(encoder,'\x01');
  Encoder::put64(encoder,(uint64)(this->lat_).bounds_.c_[0]);
  Encoder::put64(encoder,(uint64)(this->lat_).bounds_.c_[1]);
  Encoder::put64(encoder,(uint64)(this->lng_).bounds_.c_[0]);
  Encoder::put64(encoder,(uint64)(this->lng_).bounds_.c_[1]);
  if (encoder->buf_ <= encoder->limit_) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0xf8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
  abort();
}

Assistant:

void S2LatLngRect::Encode(Encoder* encoder) const {
  encoder->Ensure(40);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->putdouble(lat_.lo());
  encoder->putdouble(lat_.hi());
  encoder->putdouble(lng_.lo());
  encoder->putdouble(lng_.hi());

  S2_DCHECK_GE(encoder->avail(), 0);
}